

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O0

void __thiscall
inputArrow::inputArrow
          (inputArrow *this,int8_t id,int startY,int startX,int arrowIndex,string *label)

{
  WINDOW *pWVar1;
  undefined8 uVar2;
  string *label_local;
  int arrowIndex_local;
  int startX_local;
  int startY_local;
  int8_t id_local;
  inputArrow *this_local;
  
  arrowType::arrowType(&this->super_arrowType);
  (this->super_arrowType)._vptr_arrowType = (_func_int **)&PTR_setRequest_00129ae8;
  (this->super_arrowType).nodeId[0] = id;
  (this->super_arrowType).status[0] = '\x02';
  (this->super_arrowType).value[0] = 0;
  (this->super_arrowType).vert = arrowIndex % 2 == 0;
  if (arrowIndex == 0) {
    pWVar1 = (WINDOW *)newwin(1,0xc,startY,startX);
    (this->super_arrowType).win = pWVar1;
    wprintw((this->super_arrowType).win,anon_var_dwarf_11821);
  }
  else if (arrowIndex == 1) {
    pWVar1 = (WINDOW *)newwin(4,4,startY,startX);
    (this->super_arrowType).win = pWVar1;
    wprintw((this->super_arrowType).win,anon_var_dwarf_11837);
  }
  else if (arrowIndex == 2) {
    pWVar1 = (WINDOW *)newwin(1,0xc,startY,startX);
    (this->super_arrowType).win = pWVar1;
    wprintw((this->super_arrowType).win,anon_var_dwarf_11841);
  }
  else {
    pWVar1 = (WINDOW *)newwin(4,4,startY,startX);
    (this->super_arrowType).win = pWVar1;
    wprintw((this->super_arrowType).win,anon_var_dwarf_1184b);
  }
  pWVar1 = (this->super_arrowType).win;
  uVar2 = std::__cxx11::string::c_str();
  mvwprintw(pWVar1,0,0,"%s",uVar2);
  wrefresh((this->super_arrowType).win);
  return;
}

Assistant:

inputArrow::inputArrow(int8_t id, int startY, int startX, int arrowIndex, string label) {
	nodeId[0] = id;

	status[0] = WAIT;

	value[0] = 0;

	vert = arrowIndex % 2 == 0;

	if (arrowIndex == 0) {
		win = newwin(ARROW_V_HEIGHT, ARROW_V_WIDTH, startY, startX);
		wprintw(win, DO_ARROW);
	} else if (arrowIndex == 1) {
		win = newwin(ARROW_H_HEIGHT, ARROW_H_WIDTH, startY, startX);
		wprintw(win, LE_ARROW);
	} else if (arrowIndex == 2) {
		win = newwin(ARROW_V_HEIGHT, ARROW_V_WIDTH, startY, startX);
		wprintw(win, UP_ARROW);
	} else {
		win = newwin(ARROW_H_HEIGHT, ARROW_H_WIDTH, startY, startX);
		wprintw(win, RI_ARROW);
	}

	mvwprintw(win, 0, 0, "%s", label.c_str());
	//updateValues();

	wrefresh(win);

	return;
}